

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

Index __thiscall Scope::GetPositionForIndex(Scope *this,Index i)

{
  Index IVar1;
  ostream *poVar2;
  E *this_00;
  Index *pIVar3;
  stringstream ss;
  ostream local_188 [376];
  
  pIVar3 = (this->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  IVar1 = 0;
  do {
    if (*pIVar3 == i) {
      return IVar1;
    }
    IVar1 = IVar1 + 1;
    pIVar3 = pIVar3 + 1;
  } while (pIVar3 != (this->super_SDT).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_188,"Scope::GetPositionForIndex(Index i=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,") not found!");
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

Index Scope::GetPositionForIndex(Index i) const
{
    SDT::const_iterator it = this->begin();
    Index pos = 0;
    while( *it != i )
    {
        pos++;
        it++;
        if(it == this->end())
        {
            stringstream ss;
            ss << "Scope::GetPositionForIndex(Index i=" << i <<") not found!";
            throw E(ss);
        }

    }
    // *it == i, so...
    return(pos);
}